

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnectionTestCase.cpp
# Opt level: O0

void __thiscall
CATCH2_INTERNAL_TEST_0::BaseSocketConnection::BaseSocketConnection(BaseSocketConnection *this)

{
  Dictionary DVar1;
  Dictionary DVar2;
  string *psVar3;
  string *psVar4;
  string *psVar5;
  BeginString *pBVar6;
  TimeRange *this_00;
  pointer pTVar7;
  type pTVar8;
  pointer __p;
  SocketInitiator *this_01;
  pointer __p_00;
  undefined4 in_stack_fffffffffffff018;
  undefined4 in_stack_fffffffffffff01c;
  undefined8 in_stack_fffffffffffff020;
  TestApplication *pTVar9;
  undefined8 in_stack_fffffffffffff028;
  MemoryStoreFactory *pMVar10;
  undefined8 in_stack_fffffffffffff030;
  SessionSettings *settings;
  undefined8 in_stack_fffffffffffff038;
  unique_ptr<TestSocketInitiator,_std::default_delete<TestSocketInitiator>_> *this_02;
  undefined8 in_stack_fffffffffffff040;
  undefined8 in_stack_fffffffffffff048;
  undefined8 in_stack_fffffffffffff050;
  undefined8 in_stack_fffffffffffff058;
  SessionID *sessionId;
  undefined8 in_stack_fffffffffffff060;
  BaseSocketConnection *provider;
  undefined8 in_stack_fffffffffffff068;
  Dictionary local_c38;
  allocator<char> local_bd9;
  string local_bd8 [39];
  allocator<char> local_bb1;
  string local_bb0 [39];
  allocator<char> local_b89;
  string local_b88 [39];
  allocator<char> local_b61;
  string local_b60 [39];
  allocator<char> local_b39;
  string local_b38 [39];
  allocator<char> local_b11;
  string local_b10 [39];
  allocator<char> local_ae9;
  string local_ae8 [39];
  allocator<char> local_ac1;
  string local_ac0 [39];
  allocator<char> local_a99;
  string local_a98 [39];
  allocator<char> local_a71;
  string local_a70 [39];
  allocator<char> local_a49;
  string local_a48 [39];
  allocator<char> local_a21;
  string local_a20 [39];
  allocator<char> local_9f9;
  string local_9f8 [39];
  allocator<char> local_9d1;
  string local_9d0 [32];
  Dictionary local_9b0;
  allocator<char> local_951;
  string local_950 [39];
  allocator<char> local_929;
  string local_928 [39];
  allocator<char> local_901;
  string local_900 [39];
  allocator<char> local_8d9;
  string local_8d8 [39];
  allocator<char> local_8b1;
  string local_8b0 [39];
  allocator<char> local_889;
  string local_888 [39];
  allocator<char> local_861;
  string local_860 [39];
  allocator<char> local_839;
  string local_838 [39];
  allocator<char> local_811;
  string local_810 [39];
  allocator<char> local_7e9;
  string local_7e8 [39];
  allocator<char> local_7c1;
  string local_7c0 [39];
  allocator<char> local_799;
  string local_798 [39];
  allocator<char> local_771;
  string local_770 [39];
  allocator<char> local_749;
  string local_748 [39];
  allocator<char> local_721;
  string local_720 [39];
  allocator<char> local_6f9;
  string local_6f8 [39];
  undefined1 local_6d1;
  UtcTimeOnly local_6d0;
  UtcTimeOnly local_6b8;
  allocator<char> local_699;
  string local_698;
  string local_678;
  allocator<char> local_651;
  string local_650;
  string local_630;
  allocator<char> local_609;
  string local_608;
  allocator<char> local_5e1;
  STRING local_5e0;
  StringField local_5c0;
  allocator<char> local_561;
  STRING local_560;
  StringField local_540;
  allocator<char> local_4e1;
  STRING local_4e0;
  StringField local_4c0;
  SessionID local_468;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  STRING local_2e8;
  StringField local_2c8;
  allocator<char> local_269;
  STRING local_268;
  StringField local_248;
  allocator<char> local_1e9;
  STRING local_1e8;
  StringField local_1c8;
  SessionID local_170;
  BaseSocketConnection *local_10;
  BaseSocketConnection *this_local;
  
  local_10 = this;
  FIX::DataDictionaryProvider::DataDictionaryProvider(&this->initiatorProvider);
  FIX::DataDictionaryProvider::DataDictionaryProvider(&this->acceptorProvider);
  FIX::SessionID::SessionID(&this->initiatorSessionID);
  FIX::Dictionary::Dictionary(&this->dictionaryInitiator);
  FIX::SessionSettings::SessionSettings(&this->settingsInitiator);
  FIX::SessionID::SessionID(&this->acceptorSessionID);
  FIX::Dictionary::Dictionary(&this->dictionaryAcceptor);
  FIX::SessionSettings::SessionSettings(&this->settingsAcceptor);
  TestSocketMonitor::TestSocketMonitor(&this->monitor);
  TestApplication::TestApplication(&this->application);
  FIX::MemoryStoreFactory::MemoryStoreFactory(&this->factory);
  NullLogFactory::NullLogFactory(&this->logFactory);
  FIX::SocketServer::SocketServer(&this->server,0);
  std::unique_ptr<FIX::TimeRange,std::default_delete<FIX::TimeRange>>::
  unique_ptr<std::default_delete<FIX::TimeRange>,void>
            ((unique_ptr<FIX::TimeRange,std::default_delete<FIX::TimeRange>> *)&this->sessionTime);
  std::
  unique_ptr<CATCH2_INTERNAL_TEST_0()::TestSession,std::default_delete<CATCH2_INTERNAL_TEST_0()::TestSession>>
  ::unique_ptr<std::default_delete<CATCH2_INTERNAL_TEST_0()::TestSession>,void>
            ((unique_ptr<CATCH2_INTERNAL_TEST_0()::TestSession,std::default_delete<CATCH2_INTERNAL_TEST_0()::TestSession>>
              *)&this->initiatorSession);
  std::
  unique_ptr<CATCH2_INTERNAL_TEST_0()::TestSession,std::default_delete<CATCH2_INTERNAL_TEST_0()::TestSession>>
  ::unique_ptr<std::default_delete<CATCH2_INTERNAL_TEST_0()::TestSession>,void>
            ((unique_ptr<CATCH2_INTERNAL_TEST_0()::TestSession,std::default_delete<CATCH2_INTERNAL_TEST_0()::TestSession>>
              *)&this->acceptorSession);
  std::unique_ptr<FIX::SocketInitiator,std::default_delete<FIX::SocketInitiator>>::
  unique_ptr<std::default_delete<FIX::SocketInitiator>,void>
            ((unique_ptr<FIX::SocketInitiator,std::default_delete<FIX::SocketInitiator>> *)
             &this->initiator);
  std::
  unique_ptr<CATCH2_INTERNAL_TEST_0()::TestSocketInitiator,std::default_delete<CATCH2_INTERNAL_TEST_0()::TestSocketInitiator>>
  ::unique_ptr<std::default_delete<CATCH2_INTERNAL_TEST_0()::TestSocketInitiator>,void>
            ((unique_ptr<CATCH2_INTERNAL_TEST_0()::TestSocketInitiator,std::default_delete<CATCH2_INTERNAL_TEST_0()::TestSocketInitiator>>
              *)&this->testInitiator);
  std::unique_ptr<FIX::SocketAcceptor,std::default_delete<FIX::SocketAcceptor>>::
  unique_ptr<std::default_delete<FIX::SocketAcceptor>,void>
            ((unique_ptr<FIX::SocketAcceptor,std::default_delete<FIX::SocketAcceptor>> *)
             &this->acceptor);
  this->socket = 0x65;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"FIX.4.2",&local_1e9);
  FIX::BeginString::BeginString((BeginString *)&local_1c8,&local_1e8);
  psVar3 = FIX::StringField::operator_cast_to_string_(&local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"INITIATOR",&local_269);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&local_248,&local_268);
  psVar4 = FIX::StringField::operator_cast_to_string_(&local_248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"ACCEPT",&local_2e9);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_2c8,&local_2e8);
  psVar5 = FIX::StringField::operator_cast_to_string_(&local_2c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"",&local_311);
  FIX::SessionID::SessionID(&local_170,psVar3,psVar4,psVar5,&local_310);
  FIX::SessionID::operator=(&this->initiatorSessionID,&local_170);
  FIX::SessionID::~SessionID(&local_170);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  FIX::TargetCompID::~TargetCompID((TargetCompID *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  FIX::SenderCompID::~SenderCompID((SenderCompID *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  FIX::BeginString::~BeginString((BeginString *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"FIX.4.2",&local_4e1);
  FIX::BeginString::BeginString((BeginString *)&local_4c0,&local_4e0);
  psVar3 = FIX::StringField::operator_cast_to_string_(&local_4c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_560,"ACCEPT",&local_561);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&local_540,&local_560);
  psVar4 = FIX::StringField::operator_cast_to_string_(&local_540);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e0,"INITIATOR",&local_5e1);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_5c0,&local_5e0);
  psVar5 = FIX::StringField::operator_cast_to_string_(&local_5c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,"",&local_609);
  FIX::SessionID::SessionID(&local_468,psVar3,psVar4,psVar5,&local_608);
  FIX::SessionID::operator=(&this->acceptorSessionID,&local_468);
  FIX::SessionID::~SessionID(&local_468);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator(&local_609);
  FIX::TargetCompID::~TargetCompID((TargetCompID *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator(&local_5e1);
  FIX::SenderCompID::~SenderCompID((SenderCompID *)&local_540);
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator(&local_561);
  FIX::BeginString::~BeginString((BeginString *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  pBVar6 = FIX::SessionID::getBeginString(&this->initiatorSessionID);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_650,"FIX42",&local_651);
  FIX::TestSettings::pathForSpec(&local_630,&local_650);
  FIX::DataDictionaryProvider::addTransportDataDictionary
            (&this->initiatorProvider,pBVar6,&local_630);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::~string((string *)&local_650);
  std::allocator<char>::~allocator(&local_651);
  pBVar6 = FIX::SessionID::getBeginString(&this->acceptorSessionID);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,"FIX42",&local_699);
  FIX::TestSettings::pathForSpec(&local_678,&local_698);
  FIX::DataDictionaryProvider::addTransportDataDictionary(&this->acceptorProvider,pBVar6,&local_678)
  ;
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator(&local_699);
  this_00 = (TimeRange *)operator_new(0x40);
  local_6d1 = 1;
  FIX::UtcTimeOnly::UtcTimeOnly(&local_6b8);
  FIX::UtcTimeOnly::UtcTimeOnly(&local_6d0);
  FIX::TimeRange::TimeRange(this_00,&local_6b8,&local_6d0,0,0x1f);
  local_6d1 = 0;
  std::unique_ptr<FIX::TimeRange,_std::default_delete<FIX::TimeRange>_>::reset
            (&this->sessionTime,this_00);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_6d0);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6f8,"ConnectionType",&local_6f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_720,"initiator",&local_721);
  FIX::Dictionary::setString((string *)&this->dictionaryInitiator,local_6f8);
  std::__cxx11::string::~string(local_720);
  std::allocator<char>::~allocator(&local_721);
  std::__cxx11::string::~string(local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_748,"FileStorePath",&local_749);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_770,"store",&local_771);
  FIX::Dictionary::setString((string *)&this->dictionaryInitiator,local_748);
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator(&local_771);
  std::__cxx11::string::~string(local_748);
  std::allocator<char>::~allocator(&local_749);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_798,"UseDataDictionary",&local_799);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7c0,"N",&local_7c1);
  FIX::Dictionary::setString((string *)&this->dictionaryInitiator,local_798);
  std::__cxx11::string::~string(local_7c0);
  std::allocator<char>::~allocator(&local_7c1);
  std::__cxx11::string::~string(local_798);
  std::allocator<char>::~allocator(&local_799);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7e8,"StartTime",&local_7e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_810,"12:00:00",&local_811);
  FIX::Dictionary::setString((string *)&this->dictionaryInitiator,local_7e8);
  std::__cxx11::string::~string(local_810);
  std::allocator<char>::~allocator(&local_811);
  std::__cxx11::string::~string(local_7e8);
  std::allocator<char>::~allocator(&local_7e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_838,"EndTime",&local_839);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_860,"12:00:00",&local_861);
  FIX::Dictionary::setString((string *)&this->dictionaryInitiator,local_838);
  std::__cxx11::string::~string(local_860);
  std::allocator<char>::~allocator(&local_861);
  std::__cxx11::string::~string(local_838);
  std::allocator<char>::~allocator(&local_839);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_888,"StartDay",&local_889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8b0,"Sun",&local_8b1);
  FIX::Dictionary::setString((string *)&this->dictionaryInitiator,local_888);
  std::__cxx11::string::~string(local_8b0);
  std::allocator<char>::~allocator(&local_8b1);
  std::__cxx11::string::~string(local_888);
  std::allocator<char>::~allocator(&local_889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8d8,"EndDay",&local_8d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_900,"Mon",&local_901);
  FIX::Dictionary::setString((string *)&this->dictionaryInitiator,local_8d8);
  std::__cxx11::string::~string(local_900);
  std::allocator<char>::~allocator(&local_901);
  std::__cxx11::string::~string(local_8d8);
  std::allocator<char>::~allocator(&local_8d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_928,"HeartBtInt",&local_929);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_950,"30",&local_951);
  FIX::Dictionary::setString((string *)&this->dictionaryInitiator,local_928);
  std::__cxx11::string::~string(local_950);
  std::allocator<char>::~allocator(&local_951);
  std::__cxx11::string::~string(local_928);
  std::allocator<char>::~allocator(&local_929);
  FIX::Dictionary::Dictionary(&local_9b0,&this->dictionaryInitiator);
  DVar1._vptr_Dictionary._4_4_ = in_stack_fffffffffffff01c;
  DVar1._vptr_Dictionary._0_4_ = in_stack_fffffffffffff018;
  DVar1.m_data._M_t._M_impl._0_8_ = in_stack_fffffffffffff020;
  DVar1.m_data._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = in_stack_fffffffffffff028;
  DVar1.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_fffffffffffff030;
  DVar1.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffff038;
  DVar1.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffff040;
  DVar1.m_data._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffff048;
  DVar1.m_name._0_8_ = in_stack_fffffffffffff050;
  DVar1.m_name._M_string_length = in_stack_fffffffffffff058;
  DVar1.m_name.field_2._M_allocated_capacity = in_stack_fffffffffffff060;
  DVar1.m_name.field_2._8_8_ = in_stack_fffffffffffff068;
  FIX::SessionSettings::set((SessionID *)&this->settingsInitiator,DVar1);
  FIX::Dictionary::~Dictionary(&local_9b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_9d0,"ConnectionType",&local_9d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_9f8,"acceptor",&local_9f9);
  FIX::Dictionary::setString((string *)&this->dictionaryAcceptor,local_9d0);
  std::__cxx11::string::~string(local_9f8);
  std::allocator<char>::~allocator(&local_9f9);
  std::__cxx11::string::~string(local_9d0);
  std::allocator<char>::~allocator(&local_9d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a20,"FileStorePath",&local_a21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a48,"store",&local_a49);
  FIX::Dictionary::setString((string *)&this->dictionaryAcceptor,local_a20);
  std::__cxx11::string::~string(local_a48);
  std::allocator<char>::~allocator(&local_a49);
  std::__cxx11::string::~string(local_a20);
  std::allocator<char>::~allocator(&local_a21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a70,"UseDataDictionary",&local_a71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a98,"N",&local_a99);
  FIX::Dictionary::setString((string *)&this->dictionaryAcceptor,local_a70);
  std::__cxx11::string::~string(local_a98);
  std::allocator<char>::~allocator(&local_a99);
  std::__cxx11::string::~string(local_a70);
  std::allocator<char>::~allocator(&local_a71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ac0,"StartTime",&local_ac1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ae8,"12:00:00",&local_ae9);
  FIX::Dictionary::setString((string *)&this->dictionaryAcceptor,local_ac0);
  std::__cxx11::string::~string(local_ae8);
  std::allocator<char>::~allocator(&local_ae9);
  std::__cxx11::string::~string(local_ac0);
  std::allocator<char>::~allocator(&local_ac1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b10,"EndTime",&local_b11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b38,"12:00:00",&local_b39);
  FIX::Dictionary::setString((string *)&this->dictionaryAcceptor,local_b10);
  std::__cxx11::string::~string(local_b38);
  std::allocator<char>::~allocator(&local_b39);
  std::__cxx11::string::~string(local_b10);
  std::allocator<char>::~allocator(&local_b11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b60,"StartDay",&local_b61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b88,"Sun",&local_b89);
  FIX::Dictionary::setString((string *)&this->dictionaryAcceptor,local_b60);
  std::__cxx11::string::~string(local_b88);
  std::allocator<char>::~allocator(&local_b89);
  std::__cxx11::string::~string(local_b60);
  std::allocator<char>::~allocator(&local_b61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_bb0,"EndDay",&local_bb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_bd8,"Mon",&local_bd9);
  FIX::Dictionary::setString((string *)&this->dictionaryAcceptor,local_bb0);
  std::__cxx11::string::~string(local_bd8);
  std::allocator<char>::~allocator(&local_bd9);
  std::__cxx11::string::~string(local_bb0);
  std::allocator<char>::~allocator(&local_bb1);
  FIX::Dictionary::Dictionary(&local_c38,&this->dictionaryAcceptor);
  DVar2._vptr_Dictionary._4_4_ = in_stack_fffffffffffff01c;
  DVar2._vptr_Dictionary._0_4_ = in_stack_fffffffffffff018;
  DVar2.m_data._M_t._M_impl._0_8_ = in_stack_fffffffffffff020;
  DVar2.m_data._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = in_stack_fffffffffffff028;
  DVar2.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_fffffffffffff030;
  DVar2.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffff038;
  DVar2.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffff040;
  DVar2.m_data._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffff048;
  DVar2.m_name._0_8_ = in_stack_fffffffffffff050;
  DVar2.m_name._M_string_length = in_stack_fffffffffffff058;
  DVar2.m_name.field_2._M_allocated_capacity = in_stack_fffffffffffff060;
  DVar2.m_name.field_2._8_8_ = in_stack_fffffffffffff068;
  FIX::SessionSettings::set((SessionID *)&this->settingsAcceptor,DVar2);
  FIX::Dictionary::~Dictionary(&local_c38);
  pTVar7 = (pointer)operator_new(0x888);
  pTVar8 = std::unique_ptr<FIX::TimeRange,_std::default_delete<FIX::TimeRange>_>::operator*
                     (&this->sessionTime);
  CATCH2_INTERNAL_TEST_0()::TestSession::TestSession(FIX::Application&,FIX::MessageStoreFactory&,FIX
  ::SessionID_const&,FIX::DataDictionaryProvider&,FIX::TimeRange_const__int_
            (pTVar7,(Application *)&this->application,(MessageStoreFactory *)&this->factory,
             &this->acceptorSessionID,&this->acceptorProvider,pTVar8,1);
  std::unique_ptr<TestSession,_std::default_delete<TestSession>_>::reset
            (&this->acceptorSession,pTVar7);
  __p = (pointer)operator_new(0x1d8);
  pTVar7 = std::unique_ptr<TestSession,_std::default_delete<TestSession>_>::get
                     (&this->acceptorSession);
  CATCH2_INTERNAL_TEST_0()::TestSocketAcceptor::TestSocketAcceptor(FIX::Application&,FIX::
  MessageStoreFactory&,FIX::SessionSettings_const&,FIX::Session*,FIX::LogFactory__
            (__p,(Application *)&this->application,(MessageStoreFactory *)&this->factory,
             &this->settingsAcceptor,&pTVar7->super_Session,&(this->logFactory).super_LogFactory);
  std::unique_ptr<FIX::SocketAcceptor,_std::default_delete<FIX::SocketAcceptor>_>::reset
            (&this->acceptor,__p);
  this_01 = (SocketInitiator *)operator_new(0x488);
  FIX::SocketInitiator::SocketInitiator
            (this_01,(Application *)&this->application,(MessageStoreFactory *)&this->factory,
             &this->settingsInitiator);
  std::unique_ptr<FIX::SocketInitiator,_std::default_delete<FIX::SocketInitiator>_>::reset
            (&this->initiator,this_01);
  pTVar7 = (pointer)operator_new(0x888);
  pTVar9 = &this->application;
  pMVar10 = &this->factory;
  sessionId = &this->initiatorSessionID;
  provider = this;
  pTVar8 = std::unique_ptr<FIX::TimeRange,_std::default_delete<FIX::TimeRange>_>::operator*
                     (&this->sessionTime);
  CATCH2_INTERNAL_TEST_0()::TestSession::TestSession(FIX::Application&,FIX::MessageStoreFactory&,FIX
  ::SessionID_const&,FIX::DataDictionaryProvider&,FIX::TimeRange_const__int_
            (pTVar7,(Application *)pTVar9,(MessageStoreFactory *)pMVar10,sessionId,
             &provider->initiatorProvider,pTVar8,1);
  std::unique_ptr<TestSession,_std::default_delete<TestSession>_>::reset
            (&this->initiatorSession,pTVar7);
  this_02 = &this->testInitiator;
  __p_00 = (pointer)operator_new(0x490);
  pTVar9 = &this->application;
  pMVar10 = &this->factory;
  settings = &this->settingsInitiator;
  pTVar7 = std::unique_ptr<TestSession,_std::default_delete<TestSession>_>::get
                     (&this->initiatorSession);
  CATCH2_INTERNAL_TEST_0()::TestSocketInitiator::TestSocketInitiator(FIX::Application&,FIX::
  MessageStoreFactory&,FIX::SessionSettings_const&,FIX::Session__
            (__p_00,(Application *)pTVar9,(MessageStoreFactory *)pMVar10,settings,
             &pTVar7->super_Session);
  std::unique_ptr<TestSocketInitiator,_std::default_delete<TestSocketInitiator>_>::reset
            (this_02,__p_00);
  return;
}

Assistant:

BaseSocketConnection() {
      initiatorSessionID = SessionID(BeginString("FIX.4.2"), SenderCompID("INITIATOR"), TargetCompID("ACCEPT"));

      acceptorSessionID = SessionID(BeginString("FIX.4.2"), SenderCompID("ACCEPT"), TargetCompID("INITIATOR"));

      initiatorProvider.addTransportDataDictionary(
          initiatorSessionID.getBeginString(),
          FIX::TestSettings::pathForSpec("FIX42"));
      acceptorProvider.addTransportDataDictionary(
          acceptorSessionID.getBeginString(),
          FIX::TestSettings::pathForSpec("FIX42"));

      sessionTime.reset(new TimeRange(UtcTimeOnly(), UtcTimeOnly(), 0, 31));

      dictionaryInitiator.setString("ConnectionType", "initiator");
      dictionaryInitiator.setString("FileStorePath", "store");
      dictionaryInitiator.setString(USE_DATA_DICTIONARY, "N");
      dictionaryInitiator.setString(START_TIME, "12:00:00");
      dictionaryInitiator.setString(END_TIME, "12:00:00");
      dictionaryInitiator.setString(START_DAY, "Sun");
      dictionaryInitiator.setString(END_DAY, "Mon");
      dictionaryInitiator.setString(HEARTBTINT, "30");

      settingsInitiator.set(initiatorSessionID, dictionaryInitiator);

      dictionaryAcceptor.setString("ConnectionType", "acceptor");
      dictionaryAcceptor.setString("FileStorePath", "store");
      dictionaryAcceptor.setString(USE_DATA_DICTIONARY, "N");
      dictionaryAcceptor.setString(START_TIME, "12:00:00");
      dictionaryAcceptor.setString(END_TIME, "12:00:00");
      dictionaryAcceptor.setString(START_DAY, "Sun");
      dictionaryAcceptor.setString(END_DAY, "Mon");

      settingsAcceptor.set(acceptorSessionID, dictionaryAcceptor);
      acceptorSession.reset(
          new TestSession(application, factory, acceptorSessionID, acceptorProvider, *sessionTime, 1));
      acceptor.reset(new TestSocketAcceptor(application, factory, settingsAcceptor, acceptorSession.get(), logFactory));

      initiator.reset(new SocketInitiator(application, factory, settingsInitiator));
      initiatorSession.reset(
          new TestSession(application, factory, initiatorSessionID, initiatorProvider, *sessionTime, 1));
      testInitiator.reset(new TestSocketInitiator(application, factory, settingsInitiator, initiatorSession.get()));
    }